

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O0

void __thiscall
agge::tests::QuadraticBezierCurveTests::
QBezierIteratorProducesExpectedVerticesAccordinglyToParameters(QuadraticBezierCurveTests *this)

{
  int *this_00;
  point pVar1;
  allocator local_501;
  string local_500 [32];
  LocationInfo local_4e0;
  point local_4b8;
  point local_4a8;
  undefined8 local_498;
  real_t local_490;
  point local_488;
  point local_478;
  point local_468;
  undefined1 local_458 [8];
  point reference2 [6];
  real_t local_408;
  int iStack_404;
  real_t local_400;
  real_t local_3f8;
  int iStack_3f4;
  real_t local_3f0;
  real_t local_3e8;
  int iStack_3e4;
  real_t local_3e0;
  real_t local_3d8;
  int iStack_3d4;
  real_t local_3d0;
  real_t local_3c8;
  int iStack_3c4;
  real_t local_3c0;
  point local_3b8;
  undefined1 local_3a8 [8];
  point points2 [6];
  undefined1 local_358 [8];
  qbezier b2;
  allocator local_321;
  string local_320 [32];
  LocationInfo local_300;
  point local_2d8;
  point local_2c8;
  undefined8 local_2b8;
  real_t local_2b0;
  point local_2a8;
  point local_298;
  point local_288;
  point local_278;
  point local_268;
  point local_258;
  point local_248;
  point local_238;
  point local_228;
  undefined1 local_218 [8];
  point reference1 [12];
  real_t local_178;
  int iStack_174;
  real_t local_170;
  real_t local_168;
  int iStack_164;
  real_t local_160;
  real_t local_158;
  int iStack_154;
  real_t local_150;
  real_t local_148;
  int iStack_144;
  real_t local_140;
  real_t local_138;
  int iStack_134;
  real_t local_130;
  real_t local_128;
  int iStack_124;
  real_t local_120;
  real_t local_118;
  int iStack_114;
  real_t local_110;
  real_t local_108;
  int iStack_104;
  real_t local_100;
  real_t local_f8;
  int iStack_f4;
  real_t local_f0;
  real_t local_e8;
  int iStack_e4;
  real_t local_e0;
  point local_d8;
  undefined1 local_c8 [8];
  point points1 [12];
  qbezier b1;
  QuadraticBezierCurveTests *this_local;
  
  this_00 = &points1[0xb].command;
  qbezier::qbezier((qbezier *)this_00,-3.5,7.4,1.0,2.0,10.1,3.8,0.111);
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_d8.command = pVar1.command;
  points1[0].x = (real_t)local_d8.command;
  local_d8._0_8_ = pVar1._0_8_;
  local_c8._0_4_ = local_d8.x;
  local_c8._4_4_ = local_d8.y;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_e0 = (real_t)pVar1.command;
  points1[1].x = local_e0;
  _local_e8 = pVar1._0_8_;
  points1[0].y = local_e8;
  points1[0].command = iStack_e4;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_f0 = (real_t)pVar1.command;
  points1[2].x = local_f0;
  _local_f8 = pVar1._0_8_;
  points1[1].y = local_f8;
  points1[1].command = iStack_f4;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_100 = (real_t)pVar1.command;
  points1[3].x = local_100;
  _local_108 = pVar1._0_8_;
  points1[2].y = local_108;
  points1[2].command = iStack_104;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_110 = (real_t)pVar1.command;
  points1[4].x = local_110;
  _local_118 = pVar1._0_8_;
  points1[3].y = local_118;
  points1[3].command = iStack_114;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_120 = (real_t)pVar1.command;
  points1[5].x = local_120;
  _local_128 = pVar1._0_8_;
  points1[4].y = local_128;
  points1[4].command = iStack_124;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_130 = (real_t)pVar1.command;
  points1[6].x = local_130;
  _local_138 = pVar1._0_8_;
  points1[5].y = local_138;
  points1[5].command = iStack_134;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_140 = (real_t)pVar1.command;
  points1[7].x = local_140;
  _local_148 = pVar1._0_8_;
  points1[6].y = local_148;
  points1[6].command = iStack_144;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_150 = (real_t)pVar1.command;
  points1[8].x = local_150;
  _local_158 = pVar1._0_8_;
  points1[7].y = local_158;
  points1[7].command = iStack_154;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_160 = (real_t)pVar1.command;
  points1[9].x = local_160;
  _local_168 = pVar1._0_8_;
  points1[8].y = local_168;
  points1[8].command = iStack_164;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_170 = (real_t)pVar1.command;
  points1[10].x = local_170;
  _local_178 = pVar1._0_8_;
  points1[9].y = local_178;
  points1[9].command = iStack_174;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  points1[0xb].x = (real_t)pVar1.command;
  reference1[0xb]._4_8_ = pVar1._0_8_;
  points1[10]._4_8_ = reference1[0xb]._4_8_;
  pVar1 = moveto(-3.5,7.4);
  local_228.command = pVar1.command;
  reference1[0].x = (real_t)local_228.command;
  local_228._0_8_ = pVar1._0_8_;
  local_218._0_4_ = local_228.x;
  local_218._4_4_ = local_228.y;
  local_228 = pVar1;
  pVar1 = lineto(-2.4443235,6.289911);
  local_238.command = pVar1.command;
  reference1[1].x = (real_t)local_238.command;
  local_238._0_8_ = pVar1._0_8_;
  reference1[0].y = local_238.x;
  reference1[0].command = (int)local_238.y;
  local_238 = pVar1;
  pVar1 = lineto(-1.2752936,5.357245);
  local_248.command = pVar1.command;
  reference1[2].x = (real_t)local_248.command;
  local_248._0_8_ = pVar1._0_8_;
  reference1[1].y = local_248.x;
  reference1[1].command = (int)local_248.y;
  local_248 = pVar1;
  pVar1 = lineto(0.0070893764,4.6020007);
  local_258.command = pVar1.command;
  reference1[3].x = (real_t)local_258.command;
  local_258._0_8_ = pVar1._0_8_;
  reference1[2].y = local_258.x;
  reference1[2].command = (int)local_258.y;
  local_258 = pVar1;
  pVar1 = lineto(1.4028258,4.024179);
  local_268.command = pVar1.command;
  reference1[4].x = (real_t)local_268.command;
  local_268._0_8_ = pVar1._0_8_;
  reference1[3].y = local_268.x;
  reference1[3].command = (int)local_268.y;
  local_268 = pVar1;
  pVar1 = lineto(2.9119153,3.62378);
  local_278.command = pVar1.command;
  reference1[5].x = (real_t)local_278.command;
  local_278._0_8_ = pVar1._0_8_;
  reference1[4].y = local_278.x;
  reference1[4].command = (int)local_278.y;
  local_278 = pVar1;
  pVar1 = lineto(4.5343575,3.400803);
  local_288.command = pVar1.command;
  reference1[6].x = (real_t)local_288.command;
  local_288._0_8_ = pVar1._0_8_;
  reference1[5].y = local_288.x;
  reference1[5].command = (int)local_288.y;
  local_288 = pVar1;
  pVar1 = lineto(6.270154,3.3552487);
  local_298.command = pVar1.command;
  reference1[7].x = (real_t)local_298.command;
  local_298._0_8_ = pVar1._0_8_;
  reference1[6].y = local_298.x;
  reference1[6].command = (int)local_298.y;
  local_298 = pVar1;
  pVar1 = lineto(8.119303,3.4871166);
  local_2a8.command = pVar1.command;
  reference1[8].x = (real_t)local_2a8.command;
  local_2a8._0_8_ = pVar1._0_8_;
  reference1[7].y = local_2a8.x;
  reference1[7].command = (int)local_2a8.y;
  local_2a8 = pVar1;
  pVar1 = lineto(10.081805,3.7964072);
  local_2b0 = (real_t)pVar1.command;
  local_2b8 = pVar1._0_8_;
  reference1[8]._4_8_ = local_2b8;
  reference1[9].x = local_2b0;
  pVar1 = lineto(10.1,3.8);
  local_2c8.command = pVar1.command;
  reference1[10].x = (real_t)local_2c8.command;
  local_2c8._0_8_ = pVar1._0_8_;
  reference1[9].y = local_2c8.x;
  reference1[9].command = (int)local_2c8.y;
  local_2c8 = pVar1;
  pVar1 = stop();
  local_2d8.command = pVar1.command;
  reference1[0xb].x = (real_t)local_2d8.command;
  local_2d8._0_8_ = pVar1._0_8_;
  reference1[10].y = local_2d8.x;
  reference1[10].command = (int)local_2d8.y;
  local_2d8 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_320,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_321);
  ut::LocationInfo::LocationInfo(&local_300,(string *)local_320,0x73);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,12ul>
            ((point (*) [12])local_218,(point (*) [12])local_c8,&local_300);
  ut::LocationInfo::~LocationInfo(&local_300);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  qbezier::qbezier((qbezier *)local_358,1.0,1.0,0.0,0.0,-1.0,1.0,0.3);
  pVar1 = vertex<agge::qbezier>((qbezier *)local_358);
  local_3b8.command = pVar1.command;
  points2[0].x = (real_t)local_3b8.command;
  local_3b8._0_8_ = pVar1._0_8_;
  local_3a8._0_4_ = local_3b8.x;
  local_3a8._4_4_ = local_3b8.y;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_358);
  local_3c0 = (real_t)pVar1.command;
  points2[1].x = local_3c0;
  _local_3c8 = pVar1._0_8_;
  points2[0].y = local_3c8;
  points2[0].command = iStack_3c4;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_358);
  local_3d0 = (real_t)pVar1.command;
  points2[2].x = local_3d0;
  _local_3d8 = pVar1._0_8_;
  points2[1].y = local_3d8;
  points2[1].command = iStack_3d4;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_358);
  local_3e0 = (real_t)pVar1.command;
  points2[3].x = local_3e0;
  _local_3e8 = pVar1._0_8_;
  points2[2].y = local_3e8;
  points2[2].command = iStack_3e4;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_358);
  local_3f0 = (real_t)pVar1.command;
  points2[4].x = local_3f0;
  _local_3f8 = pVar1._0_8_;
  points2[3].y = local_3f8;
  points2[3].command = iStack_3f4;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_358);
  local_400 = (real_t)pVar1.command;
  points2[5].x = local_400;
  _local_408 = pVar1._0_8_;
  points2[4].y = local_408;
  points2[4].command = iStack_404;
  pVar1 = moveto(1.0,1.0);
  local_468.command = pVar1.command;
  reference2[0].x = (real_t)local_468.command;
  local_468._0_8_ = pVar1._0_8_;
  local_458._0_4_ = local_468.x;
  local_458._4_4_ = local_468.y;
  local_468 = pVar1;
  pVar1 = lineto(0.39999998,0.58);
  local_478.command = pVar1.command;
  reference2[1].x = (real_t)local_478.command;
  local_478._0_8_ = pVar1._0_8_;
  reference2[0].y = local_478.x;
  reference2[0].command = (int)local_478.y;
  local_478 = pVar1;
  pVar1 = lineto(-0.20000003,0.52);
  local_488.command = pVar1.command;
  reference2[2].x = (real_t)local_488.command;
  local_488._0_8_ = pVar1._0_8_;
  reference2[1].y = local_488.x;
  reference2[1].command = (int)local_488.y;
  local_488 = pVar1;
  pVar1 = lineto(-0.8000001,0.82000005);
  local_490 = (real_t)pVar1.command;
  local_498 = pVar1._0_8_;
  reference2[2]._4_8_ = local_498;
  reference2[3].x = local_490;
  pVar1 = lineto(-1.0,1.0);
  local_4a8.command = pVar1.command;
  reference2[4].x = (real_t)local_4a8.command;
  local_4a8._0_8_ = pVar1._0_8_;
  reference2[3].y = local_4a8.x;
  reference2[3].command = (int)local_4a8.y;
  local_4a8 = pVar1;
  pVar1 = stop();
  local_4b8.command = pVar1.command;
  reference2[5].x = (real_t)local_4b8.command;
  local_4b8._0_8_ = pVar1._0_8_;
  reference2[4].y = local_4b8.x;
  reference2[4].command = (int)local_4b8.y;
  local_4b8 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_500,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_501);
  ut::LocationInfo::LocationInfo(&local_4e0,(string *)local_500,0x87);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_458,(point (*) [6])local_3a8,&local_4e0);
  ut::LocationInfo::~LocationInfo(&local_4e0);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  return;
}

Assistant:

test( QBezierIteratorProducesExpectedVerticesAccordinglyToParameters )
			{
				// INIT
				qbezier b1(-3.5f, 7.4f, 1.0f, 2.0f, 10.1f, 3.8f, 0.111f);

				// ACT
				mocks::path::point points1[] = {
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(-3.50000000f, 7.40000010f),
					lineto(-2.44432354f, 6.28991079f),
					lineto(-1.27529359f, 5.35724497f),
					lineto(0.00708937645f, 4.60200071f),
					lineto(1.40282583f, 4.02417898f),
					lineto(2.91191530f, 3.62378001f),
					lineto(4.53435755f, 3.40080309f),
					lineto(6.27015400f, 3.35524869f),
					lineto(8.11930275f, 3.48711658f),
					lineto(10.0818052f, 3.79640722f),
					lineto(10.1000004f, 3.79999995f),
					stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(1.0f, 1.0f, 0.0f, 0.0f, -1.0f, 1.0f, 0.3f);

				// ACT
				mocks::path::point points2[] = {
					vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.00000000f, 1.00000000f),
					lineto(0.399999976f, 0.579999983f),
					lineto(-0.200000033f, 0.519999981f),
					lineto(-0.800000072f, 0.820000052f),
					lineto(-1.00000000f, 1.00000000f),
					stop(),
				};

				assert_equal(reference2, points2);
			}